

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

_Bool getn(char *prompt,int *num,int def)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char str [127];
  
  while( true ) {
    printf("%s",prompt);
    fflush(_stdout);
    pcVar3 = fgets(str,0x7f,_stdin);
    bVar1 = pcVar3 != (char *)0x0;
    if (pcVar3 == (char *)0x0) {
      return bVar1;
    }
    if (str[0] == '\n') {
      *num = def;
      return true;
    }
    iVar2 = __isoc99_sscanf(str,"%d",num);
    if (iVar2 == 1) {
      return bVar1;
    }
    if (iVar2 == -1) break;
    puts("Not a valid number!");
  }
  putchar(10);
  return false;
}

Assistant:

bool getn(const char* prompt, int* num, const int def) {
  char str[127]; // Probably overkill
  while (true) {
    printf("%s", prompt);
    fflush(stdout);
    if (!fgets(str, sizeof str, stdin)) return false;
    if (*str == '\n') { // Nothing was entered
      *num = def;
      break;
    } else {
      const int res = sscanf(str, "%d", num);
      if (res == 1) break;
      else if (res == EOF) {
        printf("\n");
        return false;
      } else {
        printf("Not a valid number!\n");
      }
    }
  }

  return true;
}